

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

bool __thiscall
bssl::dtls1_process_handshake_fragments
          (bssl *this,SSL *ssl,uint8_t *out_alert,DTLSRecordNumber record_number,
          Span<const_unsigned_char> record)

{
  Span<const_unsigned_char> span;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  size_t sVar4;
  ulong pos;
  ulong uVar5;
  uchar *dst;
  uint8_t *src;
  pointer ctx;
  OPENSSL_timeval now_00;
  OPENSSL_timeval OVar6;
  OPENSSL_timeval now;
  Span<unsigned_char> local_c8;
  undefined1 local_b8 [8];
  Span<unsigned_char> dest;
  DTLSIncomingMessage *frag;
  size_t msg_len;
  size_t frag_len;
  size_t frag_off;
  CBS body;
  uint local_70;
  hm_header_st msg_hdr;
  undefined1 local_50 [8];
  CBS cbs;
  bool skipped_fragments;
  bool implicit_ack;
  uint8_t *out_alert_local;
  SSL *ssl_local;
  Span<const_unsigned_char> record_local;
  DTLSRecordNumber record_number_local;
  
  record_local.data_ = record.data_;
  cbs.len._7_1_ = 0;
  cbs.len._6_1_ = 0;
  span.size_ = (size_t)record_local.data_;
  span.data_ = (uchar *)record_number.combined_;
  record_local.size_ = (size_t)out_alert;
  cbs_st::cbs_st((cbs_st *)local_50,span);
  while( true ) {
    while( true ) {
      do {
        sVar4 = CBS_len((CBS *)local_50);
        if (sVar4 == 0) {
          if ((cbs.len._7_1_ & 1) != 0) {
            dtls1_stop_timer((SSL *)this);
            dtls_clear_outgoing_messages((SSL *)this);
          }
          if ((cbs.len._6_1_ & 1) == 0) {
            MRUQueue<bssl::DTLSRecordNumber,_32UL>::PushBack
                      ((MRUQueue<bssl::DTLSRecordNumber,_32UL> *)(*(long *)(this + 0x38) + 0x2b0),
                       (DTLSRecordNumber)record_local.size_);
            bVar1 = ssl_has_final_version((SSL *)this);
            if ((((bVar1) && (uVar2 = ssl_protocol_version((SSL *)this), 0x303 < uVar2)) &&
                (bVar1 = DTLSTimer::IsSet((DTLSTimer *)(*(long *)(this + 0x38) + 0x3e0)), !bVar1))
               && ((**(ushort **)(this + 0x38) >> 6 & 1) == 0)) {
              ctx = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                              ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)(this + 0x68));
              OVar6 = ssl_ctx_get_current_time(ctx);
              now_00._12_4_ = 0;
              now_00.tv_sec = SUB128(OVar6._0_12_,0);
              now_00.tv_usec = SUB124(OVar6._0_12_,8);
              DTLSTimer::StartMicroseconds
                        ((DTLSTimer *)(*(long *)(this + 0x38) + 0x3e0),now_00,
                         (ulong)*(uint *)(*(long *)(this + 0x38) + 0x3f0) * 1000 >> 2);
            }
          }
          return true;
        }
        bVar1 = dtls1_parse_fragment
                          ((CBS *)local_50,(hm_header_st *)((long)&body.len + 4),(CBS *)&frag_off);
        if (!bVar1) {
          ERR_put_error(0x10,0,0x6d,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                        ,0x108);
          *(undefined1 *)&ssl->method = 0x32;
          return false;
        }
        pos = (ulong)msg_hdr.msg_len;
        uVar5 = (ulong)local_70;
        if ((uVar5 < pos) || (uVar5 - pos < (ulong)(uint)msg_hdr._8_4_)) {
          ERR_put_error(0x10,0,0x6d,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                        ,0x111);
          *(undefined1 *)&ssl->method = 0x2f;
          return false;
        }
      } while (((ushort)msg_hdr._0_2_ < *(ushort *)(*(long *)(this + 0x38) + 4)) ||
              ((**(ushort **)(this + 0x38) >> 4 & 1) != 0));
      uVar2 = DTLSRecordNumber::epoch((DTLSRecordNumber *)&record_local.size_);
      if ((uVar2 != *(uint16_t *)(*(long *)(this + 0x38) + 8)) ||
         (bVar1 = std::operator!=((unique_ptr<bssl::DTLSReadEpoch,_bssl::internal::Deleter> *)
                                  (*(long *)(this + 0x38) + 0x90),(nullptr_t)0x0), bVar1)) {
        ERR_put_error(0x10,0,0xff,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                      ,0x126);
        *(undefined1 *)&ssl->method = 10;
        return false;
      }
      sVar4 = ssl_max_handshake_message_len((SSL *)this);
      if (sVar4 < uVar5) {
        ERR_put_error(0x10,0,0x96,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                      ,300);
        *(undefined1 *)&ssl->method = 0x2f;
        return false;
      }
      iVar3 = SSL_in_init((SSL *)this);
      if (((iVar3 != 0) && (bVar1 = ssl_has_final_version((SSL *)this), bVar1)) &&
         (uVar2 = ssl_protocol_version((SSL *)this), 0x303 < uVar2)) {
        cbs.len._7_1_ = 1;
      }
      if ((int)((uint)(ushort)msg_hdr._0_2_ - (uint)*(ushort *)(*(long *)(this + 0x38) + 4)) < 8)
      break;
      cbs.len._6_1_ = 1;
    }
    dest.size_ = (size_t)dtls1_get_incoming_message
                                   ((SSL *)this,(uint8_t *)ssl,(hm_header_st *)((long)&body.len + 4)
                                   );
    if ((DTLSIncomingMessage *)dest.size_ == (DTLSIncomingMessage *)0x0) {
      return false;
    }
    sVar4 = DTLSIncomingMessage::msg_len((DTLSIncomingMessage *)dest.size_);
    if (sVar4 != uVar5) break;
    bVar1 = DTLSMessageBitmap::IsComplete((DTLSMessageBitmap *)(dest.size_ + 0x18));
    if (!bVar1) {
      if (uVar5 == 0) {
        __assert_fail("msg_len > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                      ,0x150,
                      "bool bssl::dtls1_process_handshake_fragments(SSL *, uint8_t *, DTLSRecordNumber, Span<const uint8_t>)"
                     );
      }
      local_c8 = DTLSIncomingMessage::msg((DTLSIncomingMessage *)dest.size_);
      sVar4 = CBS_len((CBS *)&frag_off);
      _local_b8 = Span<unsigned_char>::subspan(&local_c8,pos,sVar4);
      dst = Span<unsigned_char>::data((Span<unsigned_char> *)local_b8);
      src = CBS_data((CBS *)&frag_off);
      sVar4 = CBS_len((CBS *)&frag_off);
      ::OPENSSL_memcpy(dst,src,sVar4);
      DTLSMessageBitmap::MarkRange
                ((DTLSMessageBitmap *)(dest.size_ + 0x18),pos,pos + (uint)msg_hdr._8_4_);
    }
  }
  __assert_fail("frag->msg_len() == msg_len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                ,0x14a,
                "bool bssl::dtls1_process_handshake_fragments(SSL *, uint8_t *, DTLSRecordNumber, Span<const uint8_t>)"
               );
}

Assistant:

bool dtls1_process_handshake_fragments(SSL *ssl, uint8_t *out_alert,
                                       DTLSRecordNumber record_number,
                                       Span<const uint8_t> record) {
  bool implicit_ack = false;
  bool skipped_fragments = false;
  CBS cbs = record;
  while (CBS_len(&cbs) > 0) {
    // Read a handshake fragment.
    struct hm_header_st msg_hdr;
    CBS body;
    if (!dtls1_parse_fragment(&cbs, &msg_hdr, &body)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_HANDSHAKE_RECORD);
      *out_alert = SSL_AD_DECODE_ERROR;
      return false;
    }

    const size_t frag_off = msg_hdr.frag_off;
    const size_t frag_len = msg_hdr.frag_len;
    const size_t msg_len = msg_hdr.msg_len;
    if (frag_off > msg_len || frag_len > msg_len - frag_off) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_HANDSHAKE_RECORD);
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      return false;
    }

    if (msg_hdr.seq < ssl->d1->handshake_read_seq ||
        ssl->d1->handshake_read_overflow) {
      // Ignore fragments from the past. This is a retransmit of data we already
      // received.
      //
      // TODO(crbug.com/42290594): Use this to drive retransmits.
      continue;
    }

    if (record_number.epoch() != ssl->d1->read_epoch.epoch ||
        ssl->d1->next_read_epoch != nullptr) {
      // New messages can only arrive in the latest epoch. This can fail if the
      // record came from |prev_read_epoch|, or if it came from |read_epoch| but
      // |next_read_epoch| exists. (It cannot come from |next_read_epoch|
      // because |next_read_epoch| becomes |read_epoch| once it receives a
      // record.)
      OPENSSL_PUT_ERROR(SSL, SSL_R_EXCESS_HANDSHAKE_DATA);
      *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
      return false;
    }

    if (msg_len > ssl_max_handshake_message_len(ssl)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_EXCESSIVE_MESSAGE_SIZE);
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      return false;
    }

    if (SSL_in_init(ssl) && ssl_has_final_version(ssl) &&
        ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
      // During the handshake, if we receive any portion of the next flight, the
      // peer must have received our most recent flight. In DTLS 1.3, this is an
      // implicit ACK. See RFC 9147, Section 7.1.
      //
      // This only applies during the handshake. After the handshake, the next
      // message may be part of a post-handshake transaction. It also does not
      // apply immediately after the handshake. As a client, receiving a
      // KeyUpdate or NewSessionTicket does not imply the server has received
      // our Finished. The server may have sent those messages in half-RTT.
      implicit_ack = true;
    }

    if (msg_hdr.seq - ssl->d1->handshake_read_seq > SSL_MAX_HANDSHAKE_FLIGHT) {
      // Ignore fragments too far in the future.
      skipped_fragments = true;
      continue;
    }

    DTLSIncomingMessage *frag =
        dtls1_get_incoming_message(ssl, out_alert, &msg_hdr);
    if (frag == nullptr) {
      return false;
    }
    assert(frag->msg_len() == msg_len);

    if (frag->reassembly.IsComplete()) {
      // The message is already assembled.
      continue;
    }
    assert(msg_len > 0);

    // Copy the body into the fragment.
    Span<uint8_t> dest = frag->msg().subspan(frag_off, CBS_len(&body));
    OPENSSL_memcpy(dest.data(), CBS_data(&body), CBS_len(&body));
    frag->reassembly.MarkRange(frag_off, frag_off + frag_len);
  }

  if (implicit_ack) {
    dtls1_stop_timer(ssl);
    dtls_clear_outgoing_messages(ssl);
  }

  if (!skipped_fragments) {
    ssl->d1->records_to_ack.PushBack(record_number);

    if (ssl_has_final_version(ssl) &&
        ssl_protocol_version(ssl) >= TLS1_3_VERSION &&
        !ssl->d1->ack_timer.IsSet() && !ssl->d1->sending_ack) {
      // Schedule sending an ACK. The delay serves several purposes:
      // - If there are more records to come, we send only one ACK.
      // - If there are more records to come and the flight is now complete, we
      //   will send the reply (which implicitly ACKs the previous flight) and
      //   cancel the timer.
      // - If there are more records to come, the flight is now complete, but
      //   generating the response is delayed (e.g. a slow, async private key),
      //   the timer will fire and we send an ACK anyway.
      OPENSSL_timeval now = ssl_ctx_get_current_time(ssl->ctx.get());
      ssl->d1->ack_timer.StartMicroseconds(
          now, uint64_t{ssl->d1->timeout_duration_ms} * 1000 / 4);
    }
  }

  return true;
}